

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# vktWsiDisplayTimingTests.cpp
# Opt level: O0

void vkt::wsi::anon_unknown_0::deinitCommandBuffers
               (DeviceInterface *vkd,VkDevice device,VkCommandPool commandPool,
               vector<vk::VkCommandBuffer_s_*,_std::allocator<vk::VkCommandBuffer_s_*>_>
               *commandBuffers)

{
  size_type sVar1;
  reference ppVVar2;
  ulong local_30;
  size_t ndx;
  vector<vk::VkCommandBuffer_s_*,_std::allocator<vk::VkCommandBuffer_s_*>_> *commandBuffers_local;
  VkDevice device_local;
  DeviceInterface *vkd_local;
  VkCommandPool commandPool_local;
  
  local_30 = 0;
  while( true ) {
    sVar1 = std::vector<vk::VkCommandBuffer_s_*,_std::allocator<vk::VkCommandBuffer_s_*>_>::size
                      (commandBuffers);
    if (sVar1 <= local_30) break;
    ppVVar2 = std::vector<vk::VkCommandBuffer_s_*,_std::allocator<vk::VkCommandBuffer_s_*>_>::
              operator[](commandBuffers,local_30);
    if (*ppVVar2 != (value_type)0x0) {
      ppVVar2 = std::vector<vk::VkCommandBuffer_s_*,_std::allocator<vk::VkCommandBuffer_s_*>_>::
                operator[](commandBuffers,local_30);
      (*vkd->_vptr_DeviceInterface[0x48])(vkd,device,commandPool.m_internal,1,ppVVar2);
    }
    ppVVar2 = std::vector<vk::VkCommandBuffer_s_*,_std::allocator<vk::VkCommandBuffer_s_*>_>::
              operator[](commandBuffers,local_30);
    *ppVVar2 = (value_type)0x0;
    local_30 = local_30 + 1;
  }
  std::vector<vk::VkCommandBuffer_s_*,_std::allocator<vk::VkCommandBuffer_s_*>_>::clear
            (commandBuffers);
  return;
}

Assistant:

void deinitCommandBuffers (const vk::DeviceInterface&			vkd,
						   vk::VkDevice							device,
						   vk::VkCommandPool					commandPool,
						   std::vector<vk::VkCommandBuffer>&	commandBuffers)
{
	for (size_t ndx = 0; ndx < commandBuffers.size(); ndx++)
	{
		if (commandBuffers[ndx] != (vk::VkCommandBuffer)0)
			vkd.freeCommandBuffers(device, commandPool, 1u,  &commandBuffers[ndx]);

		commandBuffers[ndx] = (vk::VkCommandBuffer)0;
	}

	commandBuffers.clear();
}